

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O2

REF_STATUS
ref_split_edge_tet_quality
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  REF_INT RVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  double local_e8;
  REF_DBL volume1;
  REF_DBL volume0;
  REF_DBL quality1;
  REF_DBL quality0;
  REF_DBL quality;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  *allowed = 0;
  uVar6 = 0xffffffff;
  RVar8 = -1;
  if (-1 < node0) {
    pRVar2 = ref_cell->ref_adj;
    uVar6 = 0xffffffff;
    RVar8 = -1;
    if (node0 < pRVar2->nnode) {
      uVar4 = pRVar2->first[(uint)node0];
      uVar6 = 0xffffffff;
      RVar8 = -1;
      if ((long)(int)uVar4 != -1) {
        RVar8 = pRVar2->item[(int)uVar4].ref;
        uVar6 = (ulong)uVar4;
      }
    }
  }
  local_e8 = 1.0;
LAB_00142ac6:
  if ((int)uVar6 == -1) {
    uVar6 = 0xffffffff;
    RVar8 = -1;
    if (-1 < node0) {
      pRVar2 = ref_cell->ref_adj;
      uVar6 = 0xffffffff;
      RVar8 = -1;
      if (node0 < pRVar2->nnode) {
        uVar4 = pRVar2->first[(uint)node0];
        uVar6 = 0xffffffff;
        RVar8 = -1;
        if ((long)(int)uVar4 != -1) {
          RVar8 = pRVar2->item[(int)uVar4].ref;
          uVar6 = (ulong)uVar4;
        }
      }
    }
    while ((int)uVar6 != -1) {
      for (iVar9 = 0; iVar9 < ref_cell->node_per; iVar9 = iVar9 + 1) {
        if (ref_cell->c2n[ref_cell->size_per * RVar8 + iVar9] == node1) {
          uVar4 = ref_cell_nodes(ref_cell,RVar8,nodes);
          if (uVar4 != 0) {
            pcVar7 = "cell nodes";
            uVar5 = 0x259;
            goto LAB_00142bba;
          }
          iVar1 = ref_cell->node_per;
          for (lVar10 = 0; lVar10 < iVar1; lVar10 = lVar10 + 1) {
            if (nodes[lVar10] == node0) {
              nodes[lVar10] = new_node;
            }
          }
          uVar4 = ref_node_tet_quality(ref_node,nodes,&quality0);
          if (uVar4 != 0) {
            pcVar7 = "q0";
            uVar5 = 0x25d;
            goto LAB_00142bba;
          }
          uVar4 = ref_node_tet_vol(ref_node,nodes,&volume0);
          if (uVar4 != 0) {
            pcVar7 = "vol0";
            uVar5 = 0x25e;
            goto LAB_00142bba;
          }
          iVar1 = ref_cell->node_per;
          for (lVar10 = 0; lVar10 < iVar1; lVar10 = lVar10 + 1) {
            if (nodes[lVar10] == new_node) {
              nodes[lVar10] = node0;
            }
          }
          for (lVar10 = 0; lVar10 < iVar1; lVar10 = lVar10 + 1) {
            if (nodes[lVar10] == node1) {
              nodes[lVar10] = new_node;
            }
          }
          uVar4 = ref_node_tet_quality(ref_node,nodes,&quality1);
          if (uVar4 != 0) {
            pcVar7 = "q1";
            uVar5 = 0x266;
            goto LAB_00142bba;
          }
          uVar4 = ref_node_tet_vol(ref_node,nodes,&volume1);
          if (uVar4 != 0) {
            pcVar7 = "vol1";
            uVar5 = 0x267;
            goto LAB_00142bba;
          }
          dVar11 = ref_grid->adapt->split_quality_absolute;
          if ((((quality0 < dVar11) || (quality1 < dVar11)) ||
              (dVar11 = ref_grid->adapt->split_quality_relative * local_e8, quality0 < dVar11)) ||
             (((quality1 < dVar11 || (volume0 < ref_node->min_volume)) ||
              (volume1 < ref_node->min_volume)))) {
            *allowed = 0;
            goto LAB_00142dd5;
          }
        }
      }
      pRVar3 = ref_cell->ref_adj->item;
      uVar6 = (ulong)pRVar3[(int)uVar6].next;
      RVar8 = -1;
      if (uVar6 != 0xffffffffffffffff) {
        RVar8 = pRVar3[uVar6].ref;
      }
    }
    *allowed = 1;
LAB_00142dd5:
    uVar4 = 0;
  }
  else {
    lVar10 = 0;
LAB_00142adb:
    if (ref_cell->node_per <= (int)lVar10) goto LAB_00142b4d;
    if (ref_cell->c2n[(long)ref_cell->size_per * (long)RVar8 + lVar10] != node1) {
LAB_00142b48:
      lVar10 = lVar10 + 1;
      goto LAB_00142adb;
    }
    uVar4 = ref_cell_nodes(ref_cell,RVar8,nodes);
    if (uVar4 == 0) {
      uVar4 = ref_node_tet_quality(ref_node,nodes,&quality);
      if (uVar4 != 0) {
        pcVar7 = "q";
        uVar5 = 0x254;
        goto LAB_00142bba;
      }
      if (quality <= local_e8) {
        local_e8 = quality;
      }
      goto LAB_00142b48;
    }
    pcVar7 = "cell nodes";
    uVar5 = 0x252;
LAB_00142bba:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar5,
           "ref_split_edge_tet_quality",(ulong)uVar4,pcVar7);
  }
  return uVar4;
LAB_00142b4d:
  pRVar3 = ref_cell->ref_adj->item;
  uVar6 = (ulong)pRVar3[(int)uVar6].next;
  RVar8 = -1;
  if (uVar6 != 0xffffffffffffffff) {
    RVar8 = pRVar3[uVar6].ref;
  }
  goto LAB_00142ac6;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_tet_quality(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node,
                                              REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_DBL quality, quality0, quality1;
  REF_DBL volume0, volume1;
  REF_DBL min_existing_quality;

  *allowed = REF_FALSE;

  min_existing_quality = 1.0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");

    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "q");
    min_existing_quality = MIN(min_existing_quality, quality);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tet_quality(ref_node, nodes, &quality0), "q0");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume0), "vol0");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }
    RSS(ref_node_tet_quality(ref_node, nodes, &quality1), "q1");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume1), "vol1");

    if (quality0 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_absolute) ||
        quality0 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        quality1 < ref_grid_adapt(ref_grid, split_quality_relative) *
                       min_existing_quality ||
        volume0 < ref_node_min_volume(ref_node) ||
        volume1 < ref_node_min_volume(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}